

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

int detect_flash(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,int offset)

{
  double *pdVar1;
  double dVar2;
  ulong uVar3;
  
  if (offset < 0) {
    uVar3 = (ulong)offset;
    if (uVar3 * 0xe8 + (long)twopass_frame < *(ulong *)twopass) {
      return 0;
    }
  }
  else {
    uVar3 = (ulong)(uint)offset;
    if (twopass->frame_stats_arr[0] <= (FIRSTPASS_STATS *)(uVar3 * 0xe8 + (long)twopass_frame)) {
      return 0;
    }
  }
  if ((twopass_frame != (TWO_PASS_FRAME *)0x0) &&
     (dVar2 = *(double *)((long)twopass_frame + uVar3 * 0xe8 + 0x40),
     pdVar1 = (double *)((long)twopass_frame + uVar3 * 0xe8 + 0x30),
     *pdVar1 <= dVar2 && dVar2 != *pdVar1)) {
    return (int)(0.5 <= dVar2);
  }
  return 0;
}

Assistant:

static const FIRSTPASS_STATS *read_frame_stats(const TWO_PASS *p,
                                               const TWO_PASS_FRAME *p_frame,
                                               int offset) {
  if ((offset >= 0 &&
       p_frame->stats_in + offset >= p->stats_buf_ctx->stats_in_end) ||
      (offset < 0 &&
       p_frame->stats_in + offset < p->stats_buf_ctx->stats_in_start)) {
    return NULL;
  }

  return &p_frame->stats_in[offset];
}